

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

void * __thiscall
std::pmr::test_resource::do_allocate(test_resource *this,size_t bytes,size_t alignment)

{
  atomic_llong *paVar1;
  __int_type_conflict _Var2;
  long lVar3;
  test_resource_list *ptVar4;
  size_t sVar5;
  undefined4 *puVar6;
  Link *pLVar7;
  undefined8 *puVar8;
  Link *pLVar9;
  char *pcVar10;
  code *pcVar11;
  undefined4 *puVar12;
  pointer_____offset_0x10___ *ppuVar13;
  
  mutex::lock(&this->m_lock_);
  LOCK();
  paVar1 = &this->m_allocations_;
  _Var2 = (paVar1->super___atomic_base<long_long>)._M_i;
  (paVar1->super___atomic_base<long_long>)._M_i = (paVar1->super___atomic_base<long_long>)._M_i + 1;
  UNLOCK();
  if (0x10 < alignment) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = std::pmr::get_default_resource;
    pcVar11 = std::bad_alloc::~bad_alloc;
    ppuVar13 = (pointer_____offset_0x10___ *)&bad_alloc::typeinfo;
LAB_00103908:
    __cxa_throw(puVar8,ppuVar13,pcVar11);
  }
  if (-1 < (this->m_allocation_limit_).super___atomic_base<long_long>._M_i) {
    LOCK();
    paVar1 = &this->m_allocation_limit_;
    lVar3 = (paVar1->super___atomic_base<long_long>)._M_i;
    (paVar1->super___atomic_base<long_long>)._M_i =
         (paVar1->super___atomic_base<long_long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long_long>)._M_i < 0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x20);
      *puVar8 = &PTR__bad_alloc_00106d68;
      puVar8[1] = this;
      puVar8[2] = bytes;
      puVar8[3] = alignment;
      pcVar11 = std::bad_alloc::~bad_alloc;
      ppuVar13 = &test_resource_exception::typeinfo;
      goto LAB_00103908;
    }
  }
  puVar6 = (undefined4 *)(**(code **)(*(long *)this->m_pmr_ + 0x10))(this->m_pmr_,bytes + 0x50,0x10)
  ;
  (this->m_last_allocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = bytes;
  (this->m_last_allocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
  puVar6[0xc] = 0xb1b1b1b1;
  puVar6[0xd] = 0xb1b1b1b1;
  puVar6[0xe] = 0xb1b1b1b1;
  puVar6[0xf] = 0xb1b1b1b1;
  puVar12 = (undefined4 *)((long)puVar6 + bytes + 0x40);
  *puVar12 = 0xb1b1b1b1;
  puVar12[1] = 0xb1b1b1b1;
  puVar12[2] = 0xb1b1b1b1;
  puVar12[3] = 0xb1b1b1b1;
  *(size_t *)(puVar6 + 2) = bytes;
  *(size_t *)(puVar6 + 4) = alignment;
  *puVar6 = 0xdeadbeef;
  *(__int_type_conflict *)(puVar6 + 6) = _Var2;
  LOCK();
  (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
       (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  if ((this->m_max_blocks_).super___atomic_base<long_long>._M_i <
      (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i) {
    (this->m_max_blocks_).super___atomic_base<long_long>._M_i =
         (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i;
  }
  LOCK();
  (this->m_total_blocks_).super___atomic_base<long_long>._M_i =
       (this->m_total_blocks_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  LOCK();
  (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
       (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i + bytes;
  UNLOCK();
  if ((this->m_max_bytes_).super___atomic_base<long_long>._M_i <
      (long)(this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i) {
    (this->m_max_bytes_).super___atomic_base<long_long>._M_i =
         (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i;
  }
  LOCK();
  (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i =
       (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i + bytes;
  UNLOCK();
  ptVar4 = this->m_list_;
  pLVar7 = (Link *)(**(code **)(*(long *)this->m_pmr_ + 0x10))(this->m_pmr_,0x18,0x10);
  pLVar7->m_next_ = (Link *)0x0;
  puVar12 = puVar6 + 0x10;
  pLVar7->m_index_ = _Var2;
  if (ptVar4->d_head_p == (Link *)0x0) {
    ptVar4->d_head_p = pLVar7;
    pLVar9 = (Link *)0x0;
  }
  else {
    pLVar9 = ptVar4->d_tail_p;
    pLVar9->m_next_ = pLVar7;
  }
  ptVar4->d_tail_p = pLVar7;
  pLVar7->m_prev_ = pLVar9;
  *(Link **)(puVar6 + 8) = pLVar7;
  *(test_resource **)(puVar6 + 10) = this;
  (this->m_last_allocated_address_)._M_b._M_p = puVar12;
  if ((this->m_verbose_flag_).super___atomic_base<int>._M_i != 0) {
    printf("test_resource");
    sVar5 = (this->m_name_)._M_len;
    if (sVar5 != 0) {
      printf(" %.*s",sVar5,(this->m_name_)._M_str);
    }
    pcVar10 = "s ";
    if (bytes == 1) {
      pcVar10 = " ";
    }
    printf(" [%lld]: Allocated %zu byte%s(aligned %zu) at %p.\n",_Var2,bytes,pcVar10,alignment,
           puVar12);
    fflush(_stdout);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return puVar12;
}

Assistant:

void *test_resource::do_allocate(size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    long long allocationIndex = m_allocations_.fetch_add(1,
                                                         memory_order_relaxed);

    if (alignment > alignof(max_align_t)) {
        // Over-aligned allocations are not currently supported.
        throw bad_alloc();
    }

    if (0 <= allocation_limit()) {
        if (0 > m_allocation_limit_.fetch_add(-1, memory_order_relaxed) - 1) {
            throw test_resource_exception(this, bytes, alignment);
        }
    }

    AlignedHeader *head = (AlignedHeader *)m_pmr_->allocate(
                                  sizeof(AlignedHeader) + bytes + paddingSize);
    if (!head) {
        // We cannot satisfy this request.  Throw 'std::bad_alloc'.

        throw bad_alloc();
    }

    m_last_allocated_num_bytes_.store(static_cast<long long>(bytes),
                                      memory_order_relaxed);
    m_last_allocated_alignment_.store(static_cast<long long>(alignment),
                                      memory_order_relaxed);

    // Note that we don't initialize the user portion of the segment because
    // that would undermine Purify's 'UMR: uninitialized memory read' checking.

    std::memset((char *)(head + 1) - paddingSize,
                to_integer<unsigned char>(paddedMemoryByte), paddingSize);
    std::memset((char *)(head + 1) + bytes,
                to_integer<unsigned char>(paddedMemoryByte), paddingSize);

    head->m_object_.m_bytes_        = bytes;
    head->m_object_.m_alignment_    = alignment;
    head->m_object_.m_magic_number_ = allocatedMemoryPattern;
    head->m_object_.m_index_        = allocationIndex;

    m_blocks_in_use_.fetch_add(1, memory_order_relaxed);
    if (max_blocks() < blocks_in_use()) {
        m_max_blocks_.store(blocks_in_use(), memory_order_relaxed);
    }
    m_total_blocks_.fetch_add(1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(static_cast<long long>(bytes),
                              memory_order_relaxed);
    if (max_bytes() < bytes_in_use()) {
        m_max_bytes_.store(bytes_in_use(), memory_order_relaxed);
    }
    m_total_bytes_.fetch_add(static_cast<long long>(bytes),
                             memory_order_relaxed);

    Link *link = addLink(m_list_, allocationIndex, m_pmr_);
    head->m_object_.m_address_ = link;
    head->m_object_.m_pmr_      = this;

    void *address = ++head;

    m_last_allocated_address_.store(address, memory_order_relaxed);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator global [25]: Allocated 128 bytes at 0xc3a281a8.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Allocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               bytes,
               1 == bytes ? " " : "s ",
               alignment,
               address);

        std::fflush(stdout);
    }

    return address;
}